

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O2

URL * __thiscall
miniros::master::AddressResolver::resolveAddressFor
          (URL *__return_storage_ptr__,AddressResolver *this,
          shared_ptr<miniros::master::NodeRef> *node,shared_ptr<miniros::master::NodeRef> *requester
          )

{
  NodeRef *this_00;
  NetAdapter *pNVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  NetAdapter *this_01;
  pthread_mutex_t *__mutex;
  weak_ptr<const_miniros::master::HostInfo> wVar4;
  allocator<char> local_b9;
  pthread_mutex_t *local_b8;
  undefined1 local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  shared_ptr<const_miniros::master::HostInfo> nodeHost;
  shared_ptr<const_miniros::master::HostInfo> requesterHost;
  
  this_00 = (node->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this_00 == (NodeRef *)0x0) {
    network::URL::URL(__return_storage_ptr__);
  }
  else {
    NodeRef::getUrl(__return_storage_ptr__,this_00);
    if ((requester->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (resolveAddressFor::loc.initialized_ == false) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"miniros.unknown_package",(allocator<char> *)&nodeHost);
        ::std::operator+(&local_70,&local_90,".");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,&local_70,"resolver");
        console::initializeLogLocation(&resolveAddressFor::loc,(string *)local_b0,Warn);
        ::std::__cxx11::string::~string((string *)local_b0);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_90);
      }
      if (resolveAddressFor::loc.level_ != Warn) {
        console::setLogLocationLevel(&resolveAddressFor::loc,Warn);
        console::checkLogLocationEnabled(&resolveAddressFor::loc);
      }
      if (resolveAddressFor::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,resolveAddressFor::loc.logger_,
                       resolveAddressFor::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                       ,0xbe,
                       "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                       ,"resolveAddressFor(%s) - requester is null",
                       (((node->
                         super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->m_id)._M_dataplus._M_p);
      }
    }
    else {
      __mutex = (pthread_mutex_t *)&this->m_mutex;
      ::std::mutex::lock((mutex *)&__mutex->__data);
      if (this->m_resolveIp != false) {
        wVar4 = NodeRef::hostInfo((NodeRef *)local_b0);
        ::std::__shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&nodeHost.
                      super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                     ,local_b0,
                     wVar4.
                     super___weak_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
        if (nodeHost.super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
              ::loc.initialized_ == false) {
            local_b8 = __mutex;
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_90,"miniros.unknown_package",
                       (allocator<char> *)&requesterHost);
            ::std::operator+(&local_70,&local_90,".");
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b0,&local_70,"resolver");
            console::initializeLogLocation
                      (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                        ::loc,(string *)local_b0,Warn);
            ::std::__cxx11::string::~string((string *)local_b0);
            ::std::__cxx11::string::~string((string *)&local_70);
            ::std::__cxx11::string::~string((string *)&local_90);
            __mutex = local_b8;
          }
          if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
              ::loc.level_ != Warn) {
            console::setLogLocationLevel
                      (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                        ::loc,Warn);
            console::checkLogLocationEnabled
                      (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                        ::loc);
          }
          if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
              ::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                           ::loc.logger_,
                           resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                           ::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                           ,200,
                           "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                           ,"resolveAddressFor(%s) - no HostInfo",
                           (((node->
                             super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->m_id)._M_dataplus._M_p);
          }
LAB_0027c653:
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&nodeHost.
                      super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        else {
          local_b8 = __mutex;
          wVar4 = NodeRef::hostInfo((NodeRef *)local_b0);
          ::std::__shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr(&requesterHost.
                        super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                       ,local_b0,
                       wVar4.
                       super___weak_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi._M_pi);
          ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
          if (requesterHost.
              super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (element_type *)0x0) {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.initialized_ == false) {
              ::std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_90,"miniros.unknown_package",&local_b9);
              ::std::operator+(&local_70,&local_90,".");
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b0,&local_70,"resolver");
              console::initializeLogLocation
                        (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                          ::loc,(string *)local_b0,Warn);
              ::std::__cxx11::string::~string((string *)local_b0);
              ::std::__cxx11::string::~string((string *)&local_70);
              ::std::__cxx11::string::~string((string *)&local_90);
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.level_ != Warn) {
              console::setLogLocationLevel
                        (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                          ::loc,Warn);
              console::checkLogLocationEnabled
                        (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                          ::loc);
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,
                             resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                             ::loc.logger_,
                             resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                             ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                             ,0xce,
                             "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                             ,"resolveAddressFor(%s) - no HostInfo for requester %s",
                             (((node->
                               super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->m_id)._M_dataplus._M_p,
                             (((requester->
                               super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->m_id)._M_dataplus._M_p);
            }
          }
          else if (nodeHost.
                   super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr != requesterHost.
                             super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr) {
            if ((nodeHost.
                 super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->local == true) {
              pNVar1 = (this->m_adapters).
                       super__Vector_base<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (this_01 = (this->m_adapters).
                             super__Vector_base<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>
                             ._M_impl.super__Vector_impl_data._M_start; this_01 != pNVar1;
                  this_01 = this_01 + 1) {
                bVar2 = NetAdapter::hasAccessTo
                                  (this_01,requesterHost.
                                           super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
                if (bVar2) {
                  network::NetAddress::str_abi_cxx11_((string *)local_b0,&this_01->address);
LAB_0027c629:
                  ::std::__cxx11::string::operator=
                            ((string *)__return_storage_ptr__,(string *)local_b0);
                  ::std::__cxx11::string::~string((string *)local_b0);
                  __mutex = local_b8;
                  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&requesterHost.
                              super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  goto LAB_0027c653;
                }
              }
              if (console::g_initialized == '\0') {
                console::initialize();
              }
              if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                  ::loc.initialized_ == false) {
                ::std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_90,"miniros.unknown_package",&local_b9);
                ::std::operator+(&local_70,&local_90,".");
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b0,&local_70,"resolver");
                console::initializeLogLocation
                          (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                            ::loc,(string *)local_b0,Warn);
                ::std::__cxx11::string::~string((string *)local_b0);
                ::std::__cxx11::string::~string((string *)&local_70);
                ::std::__cxx11::string::~string((string *)&local_90);
              }
              if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                  ::loc.level_ != Warn) {
                console::setLogLocationLevel
                          (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                            ::loc,Warn);
                console::checkLogLocationEnabled
                          (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                            ::loc);
              }
              if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                  ::loc.logger_enabled_ == true) {
                console::print((FilterBase *)0x0,
                               resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                               ::loc.logger_,
                               resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                               ::loc.level_,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                               ,0xde,
                               "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                               ,"resolveAddressFor(%s) - no adapter matched for %s",
                               (((node->
                                 super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->m_id)._M_dataplus._M_p,
                               (((requester->
                                 super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->m_id)._M_dataplus._M_p);
              }
            }
            else {
              for (p_Var3 = ((nodeHost.
                              super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->addresses)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_left;
                  (_Rb_tree_header *)p_Var3 !=
                  &((nodeHost.
                     super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->addresses)._M_t._M_impl.super__Rb_tree_header;
                  p_Var3 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
                bVar2 = network::NetAddress::isLocal((NetAddress *)(p_Var3 + 1));
                if (!bVar2) {
                  network::NetAddress::str_abi_cxx11_((string *)local_b0,(NetAddress *)(p_Var3 + 1))
                  ;
                  goto LAB_0027c629;
                }
              }
              if (console::g_initialized == '\0') {
                console::initialize();
              }
              if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                  ::loc.initialized_ == false) {
                ::std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_90,"miniros.unknown_package",&local_b9);
                ::std::operator+(&local_70,&local_90,".");
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b0,&local_70,"resolver");
                console::initializeLogLocation
                          (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                            ::loc,(string *)local_b0,Warn);
                ::std::__cxx11::string::~string((string *)local_b0);
                ::std::__cxx11::string::~string((string *)&local_70);
                ::std::__cxx11::string::~string((string *)&local_90);
              }
              if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                  ::loc.level_ != Warn) {
                console::setLogLocationLevel
                          (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                            ::loc,Warn);
                console::checkLogLocationEnabled
                          (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                            ::loc);
              }
              if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                  ::loc.logger_enabled_ == true) {
                console::print((FilterBase *)0x0,
                               resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                               ::loc.logger_,
                               resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                               ::loc.level_,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                               ,0xe7,
                               "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                               ,"resolveAddressFor(%s) - no suitable host address found for node %s"
                               ,(((node->
                                  super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->m_id)._M_dataplus._M_p,
                               (((requester->
                                 super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->m_id)._M_dataplus._M_p);
              }
            }
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.initialized_ == false) {
              ::std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_90,"miniros.unknown_package",&local_b9);
              ::std::operator+(&local_70,&local_90,".");
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b0,&local_70,"resolver");
              console::initializeLogLocation
                        (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                          ::loc,(string *)local_b0,Warn);
              ::std::__cxx11::string::~string((string *)local_b0);
              ::std::__cxx11::string::~string((string *)&local_70);
              ::std::__cxx11::string::~string((string *)&local_90);
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.level_ != Warn) {
              console::setLogLocationLevel
                        (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                          ::loc,Warn);
              console::checkLogLocationEnabled
                        (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                          ::loc);
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,
                             resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                             ::loc.logger_,
                             resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                             ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                             ,0xea,
                             "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                             ,"resolveAddressFor(%s) - failed to resolve address for %s",
                             (((node->
                               super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->m_id)._M_dataplus._M_p,
                             (((requester->
                               super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->m_id)._M_dataplus._M_p);
            }
          }
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&requesterHost.
                      super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&nodeHost.
                      super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          __mutex = local_b8;
        }
      }
      pthread_mutex_unlock(__mutex);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

network::URL AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef>& node, const std::shared_ptr<NodeRef>& requester) const
{
  assert(node);
  if (!node)
    return {};
  network::URL url = node->getUrl();

  assert(requester);
  if (!requester) {
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - requester is null", node->id().c_str());
    return url;
  }

  std::scoped_lock lock(m_mutex);
  if (!m_resolveIp)
    return url;

  auto nodeHost = node->hostInfo().lock();
  if (!nodeHost) {
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - no HostInfo", node->id().c_str());
    return url;
  }

  auto requesterHost = requester->hostInfo().lock();
  if (!requesterHost) {
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - no HostInfo for requester %s", node->id().c_str(), requester->id().c_str());
    return url;
  }

  if (requesterHost && nodeHost == requesterHost) {
    // Both requester and node are on the same host. No additional resolution is needed.
    return url;
  }

  if (nodeHost->local) {
    for (const auto& adapter: m_adapters) {
      if (adapter.hasAccessTo(*requesterHost)) {
        url.host = adapter.address.str();
        return url;
      }
    }
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - no adapter matched for %s", node->id().c_str(), requester->id().c_str());
  } else {
    // Just return any address. That will fork for simple networks.
    for (const auto& addr: nodeHost->addresses) {
      if (!addr.isLocal()) {
        url.host = addr.str();
        return url;
      }
    }
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - no suitable host address found for node %s", node->id().c_str(), requester->id().c_str());
  }

  MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - failed to resolve address for %s", node->id().c_str(), requester->id().c_str());
  return url;
}